

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

t_int * vinlet_perform(t_int *w)

{
  long lVar1;
  undefined4 *local_30;
  t_sample *in;
  undefined4 *puStack_20;
  int n;
  t_sample *out;
  t_vinlet *x;
  t_int *w_local;
  
  lVar1 = w[1];
  local_30 = *(undefined4 **)(lVar1 + 0x60);
  in._4_4_ = (int)w[3];
  puStack_20 = (undefined4 *)w[2];
  while (in._4_4_ != 0) {
    *puStack_20 = *local_30;
    local_30 = local_30 + 1;
    in._4_4_ = in._4_4_ + -1;
    puStack_20 = puStack_20 + 1;
  }
  if (local_30 == *(undefined4 **)(lVar1 + 0x50)) {
    local_30 = *(undefined4 **)(lVar1 + 0x48);
  }
  *(undefined4 **)(lVar1 + 0x60) = local_30;
  return w + 4;
}

Assistant:

t_int *vinlet_perform(t_int *w)
{
    t_vinlet *x = (t_vinlet *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *in = x->x_read;
    while (n--) *out++ = *in++;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_read = in;
    return (w+4);
}